

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void glfwSwapInterval(int interval)

{
  _GLFWwindow *p_Var1;
  _GLFWwindow *window;
  int interval_local;
  
  if (_glfwInitialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    p_Var1 = _glfwPlatformGetCurrentContext();
    if (p_Var1 == (_GLFWwindow *)0x0) {
      _glfwInputError(0x10002,(char *)0x0);
    }
    else {
      (*(p_Var1->context).swapInterval)(interval);
    }
  }
  return;
}

Assistant:

GLFWAPI void glfwSwapInterval(int interval)
{
    _GLFWwindow* window;

    _GLFW_REQUIRE_INIT();

    window = _glfwPlatformGetCurrentContext();
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT, NULL);
        return;
    }

    window->context.swapInterval(interval);
}